

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subprocess.cpp
# Opt level: O2

void __thiscall
ManagedDescriptor::ManagedDescriptor(ManagedDescriptor *this,ManagedDescriptor *other)

{
  undefined1 uVar1;
  
  this->_descriptor = -1;
  this->_closedProperly = true;
  this->_file = (char *)0x0;
  this->_line = 0;
  this->_descriptor = other->_descriptor;
  other->_descriptor = -1;
  uVar1 = false;
  if (this->_descriptor < 0) {
    uVar1 = (undefined1)*(undefined4 *)&other->_closedProperly;
  }
  this->_closedProperly = (bool)uVar1;
  other->_closedProperly = true;
  this->_file = other->_file;
  this->_line = other->_line;
  return;
}

Assistant:

ManagedDescriptor(ManagedDescriptor&& other) {
    _descriptor = other._descriptor;
    other._descriptor = fdTraits::InvalidDescriptor;
#ifndef NDEBUG
    assert(_closedProperly);
    _closedProperly = isValid() ? false : other._closedProperly;
    other._closedProperly = true;
    _file = other._file;
    _line = other._line;
#endif
  }